

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilereaderLp.cpp
# Opt level: O3

void __thiscall
FilereaderLp::writeToFileValue(FilereaderLp *this,FILE *file,double value,bool force_plus)

{
  char *format;
  undefined7 in_register_00000011;
  
  format = " %.15g";
  if ((int)CONCAT71(in_register_00000011,force_plus) != 0) {
    format = " %+.15g";
  }
  writeToFile(this,file,format);
  return;
}

Assistant:

void FilereaderLp::writeToFileValue(FILE* file, const double value,
                                    const bool force_plus) {
  if (original_double_format) {
    this->writeToFile(file, " %+g", value);
  } else {
    // As for writeModelAsMps
    if (force_plus) {
      this->writeToFile(file, " %+.15g", value);
    } else {
      this->writeToFile(file, " %.15g", value);
    }
  }
}